

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall rw::Image::compressPalette(Image *this)

{
  int local_2c;
  byte *pbStack_28;
  int x;
  uint8 *line;
  byte *pbStack_18;
  int y;
  uint8 *pixels;
  Image *this_local;
  
  if (this->depth == 8) {
    pbStack_18 = this->pixels;
    for (line._4_4_ = 0; line._4_4_ < this->height; line._4_4_ = line._4_4_ + 1) {
      pbStack_28 = pbStack_18;
      for (local_2c = 0; local_2c < this->width; local_2c = local_2c + 1) {
        if (0xf < *pbStack_28) {
          return;
        }
        pbStack_28 = pbStack_28 + this->bpp;
      }
      pbStack_18 = pbStack_18 + this->stride;
    }
    this->depth = 4;
  }
  return;
}

Assistant:

void
Image::compressPalette(void)
{
	if(this->depth != 8)
		return;
	uint8 *pixels = this->pixels;
	for(int y = 0; y < this->height; y++){
		uint8 *line = pixels;
		for(int x = 0; x < this->width; x++){
			if(*line > 0xF) return;
			line += this->bpp;
		}
		pixels += this->stride;
	}
	this->depth = 4;
}